

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  function_record *pfVar1;
  pointer paVar2;
  type_info *ptVar3;
  long lVar4;
  PyTypeObject *pPVar5;
  handle obj;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  type_info *ptVar9;
  function_record *pfVar10;
  PyMethodDef *pPVar11;
  PyObject *pPVar12;
  PyObject *pPVar13;
  ushort uVar14;
  function_record *pfVar15;
  byte bVar16;
  object *object;
  ulong uVar17;
  function_record *pfVar18;
  char cVar19;
  pointer paVar20;
  long lVar21;
  string tname;
  capsule rec_capsule_1;
  strdup_guard guarded_strdup;
  object scope_module;
  string signature;
  accessor<pybind11::detail::accessor_policies::str_attr> local_a0;
  unique_function_record *local_80;
  size_t local_78;
  accessor<pybind11::detail::accessor_policies::str_attr> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pfVar1 = (unique_rec->_M_t).
           super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar8 = "";
  if (pfVar1->name != (char *)0x0) {
    pcVar8 = pfVar1->name;
  }
  local_78 = args;
  pcVar8 = strdup_guard::operator()(&guarded_strdup,pcVar8);
  pfVar1->name = pcVar8;
  if (pfVar1->doc != (char *)0x0) {
    pcVar8 = strdup_guard::operator()(&guarded_strdup,pfVar1->doc);
    pfVar1->doc = pcVar8;
  }
  paVar2 = *(pointer *)
            ((long)&(pfVar1->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            + 8);
  local_80 = unique_rec;
  for (paVar20 = (pfVar1->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start; paVar20 != paVar2;
      paVar20 = paVar20 + 0x20) {
    if (*(char **)paVar20 != (char *)0x0) {
      pcVar8 = strdup_guard::operator()(&guarded_strdup,*(char **)paVar20);
      *(char **)paVar20 = pcVar8;
    }
    if (*(char **)(paVar20 + 8) == (char *)0x0) {
      if (*(PyObject **)(paVar20 + 0x10) != (PyObject *)0x0) {
        repr((pybind11 *)&tname,*(PyObject **)(paVar20 + 0x10));
        cast<std::__cxx11::string>(&signature,(pybind11 *)&tname,object);
        pcVar8 = strdup_guard::operator()(&guarded_strdup,signature._M_dataplus._M_p);
        *(char **)(paVar20 + 8) = pcVar8;
        std::__cxx11::string::~string((string *)&signature);
        pybind11::object::~object((object *)&tname);
      }
    }
    else {
      pcVar8 = strdup_guard::operator()(&guarded_strdup,*(char **)(paVar20 + 8));
      *(char **)(paVar20 + 8) = pcVar8;
    }
  }
  pcVar8 = pfVar1->name;
  iVar7 = strcmp(pcVar8,"__init__");
  if (iVar7 == 0) {
    uVar14 = 1;
  }
  else {
    iVar7 = strcmp(pcVar8,"__setstate__");
    uVar14 = (ushort)(iVar7 == 0);
  }
  *(ushort *)&pfVar1->field_0x59 = uVar14 | *(ushort *)&pfVar1->field_0x59 & 0xfffe;
  signature._M_dataplus._M_p = (pointer)&signature.field_2;
  signature._M_string_length = 0;
  signature.field_2._M_local_buf[0] = '\0';
  pcVar8 = text + 1;
  bVar6 = false;
  uVar17 = 0;
  lVar21 = 0;
  do {
    cVar19 = pcVar8[-1];
    if (cVar19 == '%') {
      ptVar3 = types[lVar21];
      if (ptVar3 == (type_info *)0x0) {
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      tname._M_dataplus._M_p = (pointer)ptVar3;
      ptVar9 = detail::get_type_info((type_index *)&tname,false);
      lVar21 = lVar21 + 1;
      if (ptVar9 == (type_info *)0x0) {
        if (((pfVar1->field_0x59 & 2) == 0) || (uVar17 != 0)) {
          std::__cxx11::string::string
                    ((string *)&tname,*(char **)(ptVar3 + 8) + (**(char **)(ptVar3 + 8) == '*'),
                     (allocator *)&rec_capsule_1);
          detail::clean_type_id(&tname);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&tname);
        }
        else {
          local_a0.obj.m_ptr = (pfVar1->scope).m_ptr;
          local_a0.key = "__module__";
          local_a0.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scope_module,&local_a0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,".");
          local_70.obj.m_ptr = (pfVar1->scope).m_ptr;
          local_70.key = "__qualname__";
          local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>(&local_50,&local_70);
          std::operator+(&tname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&rec_capsule_1,&local_50);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&tname);
          std::__cxx11::string::~string((string *)&local_50);
          pybind11::object::~object(&local_70.cache);
          std::__cxx11::string::~string((string *)&rec_capsule_1);
          std::__cxx11::string::~string((string *)&scope_module);
          pybind11::object::~object(&local_a0.cache);
          uVar17 = 0;
        }
      }
      else {
        pPVar5 = ptVar9->type;
        local_a0.key = "__module__";
        local_a0.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_a0.obj.m_ptr = (PyObject *)pPVar5;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,&local_a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scope_module,".");
        local_70.key = "__qualname__";
        local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_70.obj.m_ptr = (PyObject *)pPVar5;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_50,&local_70);
        std::operator+(&tname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &rec_capsule_1,&local_50);
        std::__cxx11::string::append((string *)&signature);
        std::__cxx11::string::~string((string *)&tname);
        std::__cxx11::string::~string((string *)&local_50);
        pybind11::object::~object(&local_70.cache);
        std::__cxx11::string::~string((string *)&rec_capsule_1);
        std::__cxx11::string::~string((string *)&scope_module);
        pybind11::object::~object(&local_a0.cache);
      }
    }
    else if (cVar19 == '{') {
      bVar6 = true;
      if (*pcVar8 != '*') {
        if (((pfVar1->field_0x59 & 0x40) == 0) && (uVar17 == pfVar1->nargs_pos)) {
          std::__cxx11::string::append((char *)&signature);
        }
        lVar4 = *(long *)&(pfVar1->args).
                          super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          ._M_impl.super__Vector_impl_data;
        if (((uVar17 < (ulong)((long)*(pointer *)
                                      ((long)&(pfVar1->args).
                                              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                      + 8) - lVar4 >> 5)) && (*(long *)(lVar4 + uVar17 * 0x20) != 0)
            ) || ((*(ushort *)&pfVar1->field_0x59 & 0x10) != 0 && uVar17 == 0)) {
          std::__cxx11::string::append((char *)&signature);
        }
        else {
          std::__cxx11::to_string
                    ((string *)&rec_capsule_1,
                     uVar17 - ((*(ushort *)&pfVar1->field_0x59 >> 4 & 1) != 0));
          std::operator+(&tname,"arg",(string *)&rec_capsule_1);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&tname);
          std::__cxx11::string::~string((string *)&rec_capsule_1);
        }
        std::__cxx11::string::append((char *)&signature);
        bVar6 = false;
      }
    }
    else if (cVar19 == '}') {
      if (((!bVar6) &&
          (lVar4 = *(long *)&(pfVar1->args).
                             super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                             ._M_impl.super__Vector_impl_data,
          uVar17 < (ulong)((long)*(pointer *)
                                  ((long)&(pfVar1->args).
                                          super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  + 8) - lVar4 >> 5))) &&
         (*(long *)(lVar4 + uVar17 * 0x20 + 8) != 0)) {
        std::__cxx11::string::append((char *)&signature);
        std::__cxx11::string::append((char *)&signature);
      }
      if (((ulong)pfVar1->nargs_pos_only != 0) && (uVar17 + 1 == (ulong)pfVar1->nargs_pos_only)) {
        std::__cxx11::string::append((char *)&signature);
      }
      if (!bVar6) {
        uVar17 = uVar17 + 1;
      }
    }
    else {
      if (cVar19 == '\0') break;
      std::__cxx11::string::push_back((char)&signature);
    }
    pcVar8 = pcVar8 + 1;
  } while( true );
  if ((uVar17 != (local_78 - (*(ushort *)&pfVar1->field_0x59 >> 6 & 1)) -
                 (ulong)((*(ushort *)&pfVar1->field_0x59 >> 7 & 1) != 0)) ||
     (types[lVar21] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar8 = strdup_guard::operator()(&guarded_strdup,signature._M_dataplus._M_p);
  pfVar1->signature = pcVar8;
  std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  ::_M_shrink_to_fit(&pfVar1->args);
  pfVar1->nargs = (uint16_t)local_78;
  pPVar12 = (pfVar1->sibling).m_ptr;
  if (pPVar12 != (PyObject *)0x0) {
    if (pPVar12->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar12 = (PyObject *)pPVar12[1].ob_refcnt;
      (pfVar1->sibling).m_ptr = pPVar12;
      if (pPVar12 == (PyObject *)0x0) goto LAB_0010b950;
    }
    iVar7 = _PyObject_TypeCheck(pPVar12,(PyTypeObject *)&PyCFunction_Type);
    pPVar12 = (pfVar1->sibling).m_ptr;
    if (iVar7 == 0) {
      if ((pPVar12 != (PyObject *)&_Py_NoneStruct) && (*pfVar1->name != '_')) {
        std::__cxx11::string::string((string *)&scope_module,pfVar1->name,(allocator *)&local_a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,"Cannot overload existing non-function object \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scope_module);
        std::operator+(&tname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &rec_capsule_1,"\" with a function of the same name");
        pybind11_fail(&tname);
      }
    }
    else if ((((*(byte *)(pPVar12[1].ob_refcnt + 0x10) & 0x20) == 0) &&
             (pPVar5 = pPVar12[1].ob_type, pPVar5 != (PyTypeObject *)0x0)) &&
            ((pPVar5->ob_base).ob_base.ob_type == (PyTypeObject *)&PyCapsule_Type)) {
      (pPVar5->ob_base).ob_base.ob_refcnt = (pPVar5->ob_base).ob_base.ob_refcnt + 1;
      tname._M_dataplus._M_p = (pointer)pPVar5;
      bVar6 = detail::is_function_record_capsule((capsule *)&tname);
      if (bVar6) {
        pfVar10 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)&tname);
        pfVar18 = (function_record *)0x0;
        if ((pfVar10->scope).m_ptr == (pfVar1->scope).m_ptr) {
          pfVar18 = pfVar10;
        }
      }
      else {
        pfVar18 = (function_record *)0x0;
      }
      pybind11::object::~object((object *)&tname);
      if (pfVar18 != (function_record *)0x0) {
        pPVar12 = (pfVar1->sibling).m_ptr;
        (this->super_function).super_object.super_handle.m_ptr = pPVar12;
        if (pPVar12 != (PyObject *)0x0) {
          pPVar12->ob_refcnt = pPVar12->ob_refcnt + 1;
        }
        if (((*(ushort *)&pfVar18->field_0x59 ^ *(ushort *)&pfVar1->field_0x59) & 0x10) != 0) {
          pybind11_fail(
                       "overloading a method with both static and instance methods is not supported; #define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more details"
                       );
        }
        pfVar10 = pfVar18;
        if ((*(ushort *)&pfVar1->field_0x59 >> 8 & 1) == 0) {
          do {
            pfVar15 = pfVar10;
            pfVar10 = pfVar15->next;
          } while (pfVar10 != (function_record *)0x0);
          pfVar10 = (local_80->_M_t).
                    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
          (local_80->_M_t).
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
               (function_record *)0x0;
          pfVar15->next = pfVar10;
          if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
        }
        else {
          pfVar1->next = pfVar18;
          tname._M_dataplus._M_p = (pointer)pPVar12[1].ob_type;
          if ((PyTypeObject *)tname._M_dataplus._M_p != (PyTypeObject *)0x0) {
            (((PyTypeObject *)tname._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt =
                 (((PyTypeObject *)tname._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt + 1;
          }
          pfVar18 = (local_80->_M_t).
                    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
          (local_80->_M_t).
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
               (function_record *)0x0;
          capsule::set_pointer((capsule *)&tname,pfVar18);
          if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          pybind11::object::~object((object *)&tname);
          pfVar18 = pfVar1;
        }
        tname._M_dataplus._M_p = (pointer)&tname.field_2;
        tname._M_string_length = 0;
        tname.field_2._M_allocated_capacity =
             tname.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (DAT_001305d9 == 1) {
          std::__cxx11::string::append((char *)&tname);
          std::__cxx11::string::append((char *)&tname);
          std::__cxx11::string::append((char *)&tname);
        }
        bVar6 = false;
        goto LAB_0010bacf;
      }
    }
  }
LAB_0010b950:
  pPVar11 = (PyMethodDef *)operator_new(0x20);
  pfVar1->def = pPVar11;
  *(undefined8 *)&pPVar11->ml_flags = 0;
  pPVar11->ml_doc = (char *)0x0;
  pPVar11->ml_name = pfVar1->name;
  pPVar11->ml_meth = dispatcher;
  pPVar11->ml_flags = 3;
  pfVar18 = (local_80->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  (local_80->_M_t).
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (function_record *)0x0;
  capsule::capsule(&rec_capsule_1,pfVar18,initialize_generic::anon_class_1_0_00000001::__invoke);
  capsule::set_name(&rec_capsule_1,(char *)0x0);
  if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  scope_module.super_handle.m_ptr = (handle)(PyObject *)0x0;
  obj.m_ptr = (pfVar1->scope).m_ptr;
  if (obj.m_ptr != (PyObject *)0x0) {
    bVar6 = hasattr(obj,"__module__");
    if (bVar6) {
      tname._M_string_length = (size_type)(pfVar1->scope).m_ptr;
      tname.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_31ef0;
      tname.field_2._8_8_ = 0;
      detail::accessor::operator_cast_to_object((accessor *)&local_a0);
    }
    else {
      bVar6 = hasattr((pfVar1->scope).m_ptr,"__name__");
      if (!bVar6) goto LAB_0010ba76;
      tname._M_string_length = (size_type)(pfVar1->scope).m_ptr;
      tname.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_329da;
      tname.field_2._8_8_ = 0;
      detail::accessor::operator_cast_to_object((accessor *)&local_a0);
    }
    pybind11::object::operator=(&scope_module,(object *)&local_a0);
    pybind11::object::~object((object *)&local_a0);
    pybind11::object::~object((object *)((long)&tname.field_2 + 8));
  }
LAB_0010ba76:
  pPVar12 = (PyObject *)
            PyCMethod_New(pfVar1->def,rec_capsule_1.super_object.super_handle.m_ptr,
                          scope_module.super_handle.m_ptr,0);
  (this->super_function).super_object.super_handle.m_ptr = pPVar12;
  if (pPVar12 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object(&scope_module);
  pybind11::object::~object(&rec_capsule_1.super_object);
  tname._M_dataplus._M_p = (pointer)&tname.field_2;
  tname._M_string_length = 0;
  tname.field_2._M_allocated_capacity = tname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar6 = true;
  pfVar18 = pfVar1;
LAB_0010bacf:
  bVar16 = 1;
  iVar7 = 0;
  for (; pfVar18 != (function_record *)0x0; pfVar18 = pfVar18->next) {
    cVar19 = (char)&tname;
    if (DAT_001305d9 == 1) {
      if (0 < iVar7) {
        std::__cxx11::string::push_back(cVar19);
      }
      if (!bVar6) {
        iVar7 = iVar7 + 1;
        std::__cxx11::to_string((string *)&scope_module,iVar7);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,(string *)&scope_module,". ");
        std::__cxx11::string::append((string *)&tname);
        std::__cxx11::string::~string((string *)&rec_capsule_1);
        std::__cxx11::string::~string((string *)&scope_module);
      }
      std::__cxx11::string::append((char *)&tname);
      std::__cxx11::string::append((char *)&tname);
      std::__cxx11::string::push_back(cVar19);
    }
    if (((pfVar18->doc != (char *)0x0) && (*pfVar18->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if ((DAT_001305d9 & 1) == 0 && bVar16 == 0) {
        std::__cxx11::string::push_back(cVar19);
        bVar16 = 0;
      }
      else {
        bVar16 = bVar16 & DAT_001305d9;
      }
      if ((DAT_001305d9 & 1) != 0) {
        std::__cxx11::string::push_back(cVar19);
      }
      std::__cxx11::string::append((char *)&tname);
      if (DAT_001305d9 == 1) {
        std::__cxx11::string::push_back(cVar19);
      }
    }
  }
  pPVar12 = (this->super_function).super_object.super_handle.m_ptr;
  free(*(void **)(pPVar12[1].ob_refcnt + 0x18));
  if (tname._M_string_length == 0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = strdup(tname._M_dataplus._M_p);
  }
  *(char **)(pPVar12[1].ob_refcnt + 0x18) = pcVar8;
  if ((pfVar1->field_0x59 & 0x10) != 0) {
    pPVar13 = (PyObject *)
              PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
    (this->super_function).super_object.super_handle.m_ptr = pPVar13;
    if (pPVar13 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    _Py_DECREF(pPVar12);
  }
  std::__cxx11::string::~string((string *)&tname);
  std::__cxx11::string::~string((string *)&signature);
  strdup_guard::~strdup_guard(&guarded_strdup);
  return;
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec,
                            const char *text,
                            const std::type_info *const *types,
                            size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destruct the pointer. `initialize` (the caller) still relies on
        // the pointee being alive after this call. Only move out if a `capsule` is going to keep
        // it alive.
        auto *rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the
        // strings are only referenced before strdup'ing. So only *after* the following block could
        // `destruct` safely be called, but even then, `repr` could still throw in the middle of
        // copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) {
            rec->doc = guarded_strdup(rec->doc);
        }
        for (auto &a : rec->args) {
            if (a.name) {
                a.name = guarded_strdup(a.name);
            }
            if (a.descr) {
                a.descr = guarded_strdup(a.descr);
            } else if (a.value) {
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
            }
        }

        rec->is_constructor = (std::strcmp(rec->name, "__init__") == 0)
                              || (std::strcmp(rec->name, "__setstate__") == 0);

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name
                = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(PyExc_FutureWarning,
                         ("pybind11-bound class '" + class_name
                          + "' is using an old-style "
                            "placement-new '"
                          + func_name
                          + "' which has been deprecated. See "
                            "the upgrade guide in pybind11's docs. This message is only visible "
                            "when compiled in debug mode.")
                             .c_str(),
                         0);
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        bool is_starred = false;
        for (const auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                is_starred = *(pc + 1) == '*';
                if (is_starred) {
                    continue;
                }
                // Separator for keyword-only arguments, placed before the kw
                // arguments start (unless we are already putting an *args)
                if (!rec->has_args && arg_index == rec->nargs_pos) {
                    signature += "*, ";
                }
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (!is_starred && arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only) {
                    signature += ", /";
                }
                if (!is_starred) {
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t) {
                    pybind11_fail("Internal error while parsing type signature (1)");
                }
                if (auto *tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature += th.attr("__module__").cast<std::string>() + "."
                                 + th.attr("__qualname__").cast<std::string>();
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature += rec->scope.attr("__module__").cast<std::string>() + "."
                                 + rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args - rec->has_args - rec->has_kwargs || types[type_index] != nullptr) {
            pybind11_fail("Internal error while parsing type signature (2)");
        }

        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr())) {
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());
        }

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto *self = PyCFunction_GET_SELF(rec->sibling.ptr());
                if (!isinstance<capsule>(self)) {
                    chain = nullptr;
                } else {
                    auto rec_capsule = reinterpret_borrow<capsule>(self);
                    if (detail::is_function_record_capsule(rec_capsule)) {
                        chain = rec_capsule.get_pointer<detail::function_record>();
                        /* Never append a method to an overload chain of a parent class;
                           instead, hide the parent's overloads in this case */
                        if (!chain->scope.is(rec->scope)) {
                            chain = nullptr;
                        }
                    } else {
                        chain = nullptr;
                    }
                }
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors
            // that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_') {
                pybind11_fail("Cannot overload existing non-function object \""
                              + std::string(rec->name) + "\" with a function of the same name");
            }
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth
                = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*)()>(dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(),
                                [](void *ptr) { destruct((detail::function_record *) ptr); });
            rec_capsule.set_name(detail::get_function_record_capsule_name());
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr) {
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
            }
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method) {
                pybind11_fail(
                    "overloading a method with both static and instance methods is not supported; "
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
                    "#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more "
                    "details"
#else
                    "error while attempting to bind "
                    + std::string(rec->is_method ? "instance" : "static") + " method "
                    + std::string(pybind11::str(rec->scope.attr("__name__"))) + "."
                    + std::string(rec->name) + signature
#endif
                );
            }

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule
                    = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next) {
                    chain = chain->next;
                }
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto *it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) {
                    signatures += '\n';
                }
                if (chain) {
                    signatures += std::to_string(++index) + ". ";
                }
                signatures += rec->name;
                signatures += it->signature;
                signatures += '\n';
            }
            if (it->doc && it->doc[0] != '\0' && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures,
                // we need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) {
                        first_user_def = false;
                    } else {
                        signatures += '\n';
                    }
                }
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
                signatures += it->doc;
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc
            = signatures.empty() ? nullptr : PYBIND11_COMPAT_STRDUP(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr) {
                pybind11_fail(
                    "cpp_function::cpp_function(): Could not allocate instance method object");
            }
            Py_DECREF(func);
        }
    }